

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  int k;
  rc_data *begin;
  long lVar1;
  bool bVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  rc_size rVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  int r_size;
  undefined1 local_90 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_80;
  longdouble local_74;
  solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>
  *local_68;
  unique_ptr<baryonyx::sparse_matrix<int>::col_value[],_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_68 = this + 0x10;
  bVar7 = false;
  local_3c = theta;
  local_48 = delta;
  local_54 = kappa;
  _Var3._M_current = (first->current)._M_current;
  local_74 = obj_amp;
  local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)(tuple<int_*,_std::default_delete<int[]>_>)x;
  local_60._M_t.
  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
       (__uniq_ptr_data<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>,_true,_true>
        )(__uniq_ptr_data<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>,_true,_true>
          )last;
  while (_Var3._M_current !=
         *(int **)local_60._M_t.
                  super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                  _M_head_impl) {
    k = _Var3._M_current[-1];
    sparse_matrix<int>::row((sparse_matrix<int> *)local_90,(int)local_68);
    solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
    ::decrease_preference
              ((solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,local_3c);
    rVar4 = solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
            ::compute_reduced_costs<baryonyx::bit_array>
                      ((solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                        *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,
                       (bit_array *)
                       local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
    begin = *(rc_data **)(this + 0x60);
    lVar1 = *(long *)(this + 0x78);
    r_size = rVar4.r_size;
    for (lVar6 = 0; ((ulong)rVar4 & 0xffffffff) << 5 != lVar6; lVar6 = lVar6 + 0x20) {
      *(longdouble *)((long)&begin->value + lVar6) =
           *(longdouble *)((long)&begin->value + lVar6) +
           *(longdouble *)
            (*(long *)(lVar1 + 8) +
            (long)((row_iterator)(local_90._8_8_ + (long)*(int *)((long)&begin->id + lVar6) * 8))->
                  column * 0x10) * local_74;
    }
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>
              (begin,begin + r_size,*(random_engine **)(this + 8));
    iVar5 = rVar4.c_size + *(int *)(*(long *)(this + 0x68) + (long)k * 8);
    if (r_size < iVar5) {
      iVar5 = r_size;
    }
    bVar2 = affect<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                      ((solver_equalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                        *)this,(bit_array *)
                               local_80._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl,
                       (row_value *)local_90._8_8_,k,iVar5 + -1,r_size,local_54,local_48);
    bVar7 = (bool)(bVar7 | bVar2);
    _Var3._M_current = (first->current)._M_current + -1;
    (first->current)._M_current = _Var3._M_current;
  }
  return bVar7;
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }